

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

pa_buffer_attr * set_buffering_attribute(uint latency_frames,pa_sample_spec *sample_spec)

{
  size_t sVar1;
  pa_sample_spec *in_RDX;
  int in_ESI;
  pa_buffer_attr *in_RDI;
  pa_buffer_attr *battr;
  
  in_RDI->maxlength = 0xffffffff;
  in_RDI->prebuf = 0xffffffff;
  sVar1 = (*cubeb_pa_frame_size)(in_RDX);
  in_RDI->tlength = in_ESI * (int)sVar1;
  in_RDI->minreq = in_RDI->tlength >> 2;
  in_RDI->fragsize = in_RDI->minreq;
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
               ,"cubeb_pulse.c",0x397,(ulong)in_RDI->maxlength,(ulong)in_RDI->tlength,
               (ulong)in_RDI->prebuf,in_RDI->minreq,in_RDI->fragsize);
  }
  return in_RDI;
}

Assistant:

static pa_buffer_attr
set_buffering_attribute(unsigned int latency_frames,
                        pa_sample_spec * sample_spec)
{
  pa_buffer_attr battr;
  battr.maxlength = -1;
  battr.prebuf = -1;
  battr.tlength = latency_frames * WRAP(pa_frame_size)(sample_spec);
  battr.minreq = battr.tlength / 4;
  battr.fragsize = battr.minreq;

  LOG("Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq "
      "%u, fragsize %u",
      battr.maxlength, battr.tlength, battr.prebuf, battr.minreq,
      battr.fragsize);

  return battr;
}